

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O3

void __thiscall
nigel::IMC_Generator::generateLoadStackR0(IMC_Generator *this,shared_ptr<nigel::IM_Operator> *op)

{
  _func_int *p_Var1;
  undefined8 this_00;
  size_t i;
  _func_int *p_Var2;
  undefined1 local_111;
  undefined1 local_110 [36];
  SFR local_ec;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_40;
  
  local_ec = BR;
  std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
            ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_110,
             (allocator<nigel::IM_SFR> *)&local_111,&local_ec);
  this_00 = local_110._8_8_;
  local_40.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_110._0_8_;
  local_40.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_;
  local_110._0_8_ = (_func_int **)0x0;
  local_110._8_8_ = (element_type *)0x0;
  local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCmd(this,mov_a_adr,&local_40,&local_58);
  if ((element_type *)this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if ((element_type *)local_110._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
  }
  p_Var2 = (_func_int *)0x0;
  while( true ) {
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_110);
    p_Var1 = *(_func_int **)(local_110._0_8_ + 0x28);
    if ((element_type *)local_110._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    if (p_Var1 <= p_Var2) break;
    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,xch_a_r0,&local_b8,&local_c8);
    local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_atr0,&local_d8,&local_e8);
    p_Var2 = p_Var2 + 1;
  }
  local_110._16_8_ = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_110._24_8_ =
       (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_)->_M_use_count + 1;
    }
  }
  local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCmd(this,add_a_const,(shared_ptr<nigel::IM_Operator> *)(local_110 + 0x10),&local_68);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._24_8_);
  }
  local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCmd(this,clr_c,&local_78,&local_88);
  local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCmd(this,mov_r0_a,&local_98,&local_a8);
  return;
}

Assistant:

void IMC_Generator::generateLoadStackR0( std::shared_ptr<IM_Operator> op )
	{
		addCmd( HexOp::mov_a_adr, IM_SFR::getSFR( IM_SFR::SFR::BR ) );
		for( size_t i = 0 ; i < op->as<IM_Variable>()->scopeOffset ; i++ )
		{//Resolve scope offset
			addCmd( HexOp::xch_a_r0 );
			addCmd( HexOp::mov_a_atr0 );
		}
		addCmd( HexOp::add_a_const, op );
		addCmd( HexOp::clr_c );//Clear carry because some operations require cleared carry.
		addCmd( HexOp::mov_r0_a );
	}